

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O1

ma_result ma_bpf_get_heap_size(ma_bpf_config *pConfig,size_t *pHeapSizeInBytes)

{
  ma_result mVar1;
  ma_bpf_heap_layout heapLayout;
  ma_bpf_heap_layout local_18;
  
  if (pHeapSizeInBytes != (size_t *)0x0) {
    *pHeapSizeInBytes = 0;
    mVar1 = ma_bpf_get_heap_layout(pConfig,&local_18);
    if (mVar1 == MA_SUCCESS) {
      *pHeapSizeInBytes = local_18.sizeInBytes;
      mVar1 = MA_SUCCESS;
    }
    return mVar1;
  }
  return MA_INVALID_ARGS;
}

Assistant:

MA_API ma_result ma_bpf_get_heap_size(const ma_bpf_config* pConfig, size_t* pHeapSizeInBytes)
{
    ma_result result;
    ma_bpf_heap_layout heapLayout;

    if (pHeapSizeInBytes == NULL) {
        return MA_INVALID_ARGS;
    }

    *pHeapSizeInBytes = 0;

    result = ma_bpf_get_heap_layout(pConfig, &heapLayout);
    if (result != MA_SUCCESS) {
        return result;
    }

    *pHeapSizeInBytes = heapLayout.sizeInBytes;

    return MA_SUCCESS;
}